

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O2

void start(int thread)

{
  pthread_mutex_t *ppVar1;
  pthread_t __th;
  size_t sVar2;
  size_t sVar3;
  undefined8 uVar4;
  long lVar5;
  pthread_t *ppVar6;
  pthread_cond_t *ppVar7;
  int iVar8;
  pthread_cond_t *ppVar9;
  void *pvVar10;
  skynet_monitor *psVar11;
  ulong uVar12;
  char *__ptr;
  pthread_t *ppVar13;
  pthread_t *ppVar14;
  pthread_t *arg;
  int *piVar15;
  ulong uVar16;
  size_t sStack_60;
  ulong local_58;
  pthread_mutex_t *local_50;
  pthread_cond_t *local_48;
  pthread_t *local_40;
  pthread_cond_t *local_38;
  
  local_58 = (ulong)(thread + 3);
  lVar5 = -((ulong)(thread + 3) * 8 + 0xf & 0xfffffffffffffff0);
  local_40 = (pthread_t *)((long)&local_58 + lVar5);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 1;
  sVar2 = *(size_t *)((long)&sStack_60 + lVar5);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 0x70;
  sVar3 = *(size_t *)((long)&sStack_60 + lVar5);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 0x111992;
  ppVar9 = (pthread_cond_t *)calloc(sVar2,sVar3);
  (ppVar9->__data).__lock = thread;
  *(undefined8 *)((long)&sStack_60 + lVar5) = 0x1119ab;
  pvVar10 = malloc((long)thread * 8);
  (ppVar9->__data).__total_seq = (ulonglong)pvVar10;
  uVar16 = 0;
  if (0 < thread) {
    uVar16 = (ulong)(uint)thread;
  }
  local_38 = ppVar9;
  for (uVar12 = 0; ppVar7 = local_38, uVar16 != uVar12; uVar12 = uVar12 + 1) {
    *(undefined8 *)((long)&sStack_60 + lVar5) = 0x1119d0;
    psVar11 = skynet_monitor_new();
    *(skynet_monitor **)((long)pvVar10 + uVar12 * 8) = psVar11;
  }
  ppVar1 = (pthread_mutex_t *)((long)local_38 + 0x40);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 0x1119eb;
  iVar8 = pthread_mutex_init(ppVar1,(pthread_mutexattr_t *)0x0);
  if (iVar8 == 0) {
    local_50 = ppVar1;
    local_38 = (pthread_cond_t *)&(ppVar7->__data).__wakeup_seq;
    *(undefined8 *)((long)&sStack_60 + lVar5) = 0x111a09;
    iVar8 = pthread_cond_init((pthread_cond_t *)&(ppVar7->__data).__wakeup_seq,
                              (pthread_condattr_t *)0x0);
    ppVar13 = local_40;
    if (iVar8 == 0) {
      *(undefined8 *)((long)&sStack_60 + lVar5) = 0x111a27;
      create_thread(ppVar13,thread_monitor,ppVar9);
      *(undefined8 *)((long)&sStack_60 + lVar5) = 0x111a3a;
      create_thread(ppVar13 + 1,thread_timer,ppVar9);
      local_48 = ppVar9;
      *(undefined8 *)((long)&sStack_60 + lVar5) = 0x111a51;
      create_thread(ppVar13 + 2,thread_socket,ppVar9);
      ppVar14 = (pthread_t *)((long)&local_58 + lVar5) + (ulong)(uint)thread * -2;
      ppVar13 = ppVar13 + 3;
      piVar15 = start::weight;
      arg = ppVar14;
      for (uVar12 = 0; ppVar6 = local_40, ppVar9 = local_48, uVar16 != uVar12; uVar12 = uVar12 + 1)
      {
        *arg = (pthread_t)local_48;
        *(int *)(arg + 1) = (int)uVar12;
        iVar8 = 0;
        if (uVar12 < 0x20) {
          iVar8 = *piVar15;
        }
        *(int *)((long)arg + 0xc) = iVar8;
        ppVar14[-1] = 0x111aa0;
        create_thread(ppVar13,thread_worker,arg);
        piVar15 = piVar15 + 1;
        arg = arg + 2;
        ppVar13 = ppVar13 + 1;
      }
      uVar12 = 0;
      uVar16 = local_58 & 0xffffffff;
      if ((int)local_58 < 1) {
        uVar16 = uVar12;
      }
      for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        __th = ppVar6[uVar12];
        ppVar14[-1] = 0x111ad6;
        pthread_join(__th,(void **)0x0);
      }
      uVar12 = 0;
      uVar16 = (ulong)(uint)(ppVar9->__data).__lock;
      if ((ppVar9->__data).__lock < 1) {
        uVar16 = uVar12;
      }
      for (; ppVar1 = local_50, uVar16 != uVar12; uVar12 = uVar12 + 1) {
        psVar11 = *(skynet_monitor **)((ppVar9->__data).__total_seq + uVar12 * 8);
        ppVar14[-1] = 0x111af9;
        skynet_monitor_delete(psVar11);
      }
      ppVar14[-1] = 0x111b07;
      pthread_mutex_destroy(ppVar1);
      ppVar7 = local_38;
      ppVar14[-1] = 0x111b10;
      pthread_cond_destroy(ppVar7);
      pvVar10 = (void *)(ppVar9->__data).__total_seq;
      ppVar14[-1] = 0x111b19;
      free(pvVar10);
      ppVar14[-1] = 0x111b21;
      free(ppVar9);
      return;
    }
    __ptr = "Init cond error";
    *(undefined8 *)((long)&sStack_60 + lVar5) = 0xf;
  }
  else {
    __ptr = "Init mutex error";
    *(undefined8 *)((long)&sStack_60 + lVar5) = 0x10;
  }
  sVar2 = *(size_t *)((long)&sStack_60 + lVar5);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 1;
  sVar3 = *(size_t *)((long)&sStack_60 + lVar5);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 0x111b61;
  fwrite(__ptr,sVar2,sVar3,_stderr);
  *(undefined8 *)((long)&sStack_60 + lVar5) = 1;
  uVar4 = *(undefined8 *)((long)&sStack_60 + lVar5);
  *(code **)((long)&sStack_60 + lVar5) = create_thread;
  exit((int)uVar4);
}

Assistant:

static void
start(int thread) {
	pthread_t pid[thread+3];

	struct monitor *m = skynet_malloc(sizeof(*m));
	memset(m, 0, sizeof(*m));
	m->count = thread;
	m->sleep = 0;

	m->m = skynet_malloc(thread * sizeof(struct skynet_monitor *));
	int i;
	for (i=0;i<thread;i++) {
		m->m[i] = skynet_monitor_new();
	}
	if (pthread_mutex_init(&m->mutex, NULL)) {
		fprintf(stderr, "Init mutex error");
		exit(1);
	}
	if (pthread_cond_init(&m->cond, NULL)) {
		fprintf(stderr, "Init cond error");
		exit(1);
	}

	create_thread(&pid[0], thread_monitor, m);
	create_thread(&pid[1], thread_timer, m);
	create_thread(&pid[2], thread_socket, m);

	static int weight[] = { 
		-1, -1, -1, -1, 0, 0, 0, 0,
		1, 1, 1, 1, 1, 1, 1, 1, 
		2, 2, 2, 2, 2, 2, 2, 2, 
		3, 3, 3, 3, 3, 3, 3, 3, };
	struct worker_parm wp[thread];
	for (i=0;i<thread;i++) {
		wp[i].m = m;
		wp[i].id = i;
		if (i < sizeof(weight)/sizeof(weight[0])) {
			wp[i].weight= weight[i];
		} else {
			wp[i].weight = 0;
		}
		create_thread(&pid[i+3], thread_worker, &wp[i]);
	}

	for (i=0;i<thread+3;i++) {
		pthread_join(pid[i], NULL); 
	}

	free_monitor(m);
}